

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void * __thiscall Js::ConfigFlagsTable::GetProperty(ConfigFlagsTable *this,Flag flag)

{
  Flag flag_local;
  ConfigFlagsTable *this_local;
  
  switch(flag) {
  case ArrayValidateFlag:
    this_local = this;
    break;
  case MemOpMissingValueValidateFlag:
    this_local = (ConfigFlagsTable *)&this->MemOpMissingValueValidate;
    break;
  case OOPJITFixupValidateFlag:
    this_local = (ConfigFlagsTable *)&this->OOPJITFixupValidate;
    break;
  case ArenaNoFreeListFlag:
    this_local = (ConfigFlagsTable *)&this->ArenaNoFreeList;
    break;
  case ArenaNoPageReuseFlag:
    this_local = (ConfigFlagsTable *)&this->ArenaNoPageReuse;
    break;
  case ArenaUseHeapAllocFlag:
    this_local = (ConfigFlagsTable *)&this->ArenaUseHeapAlloc;
    break;
  case ValidateInlineStackFlag:
    this_local = (ConfigFlagsTable *)&this->ValidateInlineStack;
    break;
  case AsmDiffFlag:
    this_local = (ConfigFlagsTable *)&this->AsmDiff;
    break;
  case AsmDumpModeFlag:
    this_local = (ConfigFlagsTable *)&this->AsmDumpMode;
    break;
  case AsmJsFlag:
    this_local = (ConfigFlagsTable *)&this->AsmJs;
    break;
  case AsmJsStopOnErrorFlag:
    this_local = (ConfigFlagsTable *)&this->AsmJsStopOnError;
    break;
  case AsmJsEdgeFlag:
    this_local = (ConfigFlagsTable *)&this->AsmJsEdge;
    break;
  case WasmFlag:
    this_local = (ConfigFlagsTable *)&this->Wasm;
    break;
  case WasmI64Flag:
    this_local = (ConfigFlagsTable *)&this->WasmI64;
    break;
  case WasmFastArrayFlag:
    this_local = (ConfigFlagsTable *)&this->WasmFastArray;
    break;
  case WasmSharedArrayVirtualBufferFlag:
    this_local = (ConfigFlagsTable *)&this->WasmSharedArrayVirtualBuffer;
    break;
  case WasmMathExFilterFlag:
    this_local = (ConfigFlagsTable *)&this->WasmMathExFilter;
    break;
  case WasmCheckVersionFlag:
    this_local = (ConfigFlagsTable *)&this->WasmCheckVersion;
    break;
  case WasmAssignModuleIDFlag:
    this_local = (ConfigFlagsTable *)&this->WasmAssignModuleID;
    break;
  case WasmIgnoreLimitsFlag:
    this_local = (ConfigFlagsTable *)&this->WasmIgnoreLimits;
    break;
  case WasmFoldFlag:
    this_local = (ConfigFlagsTable *)&this->WasmFold;
    break;
  case WasmIgnoreResponseFlag:
    this_local = (ConfigFlagsTable *)&this->WasmIgnoreResponse;
    break;
  case WasmMaxTableSizeFlag:
    this_local = (ConfigFlagsTable *)&this->WasmMaxTableSize;
    break;
  case WasmThreadsFlag:
    this_local = (ConfigFlagsTable *)&this->WasmThreads;
    break;
  case WasmMultiValueFlag:
    this_local = (ConfigFlagsTable *)&this->WasmMultiValue;
    break;
  case WasmSignExtendsFlag:
    this_local = (ConfigFlagsTable *)&this->WasmSignExtends;
    break;
  case WasmNontrappingFlag:
    this_local = (ConfigFlagsTable *)&this->WasmNontrapping;
    break;
  case WasmExperimentalFlag:
    this_local = (ConfigFlagsTable *)&this->WasmExperimental;
    break;
  case WasmSimdFlag:
    this_local = (ConfigFlagsTable *)&this->WasmSimd;
    break;
  case AssertBreakFlag:
    this_local = (ConfigFlagsTable *)&this->AssertBreak;
    break;
  case AssertPopUpFlag:
    this_local = (ConfigFlagsTable *)&this->AssertPopUp;
    break;
  case AssertIgnoreFlag:
    this_local = (ConfigFlagsTable *)&this->AssertIgnore;
    break;
  case AsyncDebuggingFlag:
    this_local = (ConfigFlagsTable *)&this->AsyncDebugging;
    break;
  case BailOnNoProfileLimitFlag:
    this_local = (ConfigFlagsTable *)&this->BailOnNoProfileLimit;
    break;
  case BailOnNoProfileRejitLimitFlag:
    this_local = (ConfigFlagsTable *)&this->BailOnNoProfileRejitLimit;
    break;
  case BaselineModeFlag:
    this_local = (ConfigFlagsTable *)&this->BaselineMode;
    break;
  case DumpOnCrashFlag:
    this_local = (ConfigFlagsTable *)&this->DumpOnCrash;
    break;
  case FullMemoryDumpFlag:
    this_local = (ConfigFlagsTable *)&this->FullMemoryDump;
    break;
  case BailOutFlag:
    this_local = (ConfigFlagsTable *)&this->BailOut;
    break;
  case BailOutAtEveryLineFlag:
    this_local = (ConfigFlagsTable *)&this->BailOutAtEveryLine;
    break;
  case BailOutAtEveryByteCodeFlag:
    this_local = (ConfigFlagsTable *)&this->BailOutAtEveryByteCode;
    break;
  case BailOutAtEveryImplicitCallFlag:
    this_local = (ConfigFlagsTable *)&this->BailOutAtEveryImplicitCall;
    break;
  case BailOutByteCodeFlag:
    this_local = (ConfigFlagsTable *)&this->BailOutByteCode;
    break;
  case BenchmarkFlag:
    this_local = (ConfigFlagsTable *)&this->Benchmark;
    break;
  case BgJitFlag:
    this_local = (ConfigFlagsTable *)&this->BgJit;
    break;
  case BgParseFlag:
    this_local = (ConfigFlagsTable *)&this->BgParse;
    break;
  case BgJitDelayFlag:
    this_local = (ConfigFlagsTable *)&this->BgJitDelay;
    break;
  case BgJitDelayFgBufferFlag:
    this_local = (ConfigFlagsTable *)&this->BgJitDelayFgBuffer;
    break;
  case BgJitPendingFuncCapFlag:
    this_local = (ConfigFlagsTable *)&this->BgJitPendingFuncCap;
    break;
  case CreateFunctionProxyFlag:
    this_local = (ConfigFlagsTable *)&this->CreateFunctionProxy;
    break;
  case HybridFgJitFlag:
    this_local = (ConfigFlagsTable *)&this->HybridFgJit;
    break;
  case HybridFgJitBgQueueLengthThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->HybridFgJitBgQueueLengthThreshold;
    break;
  case BytecodeHistFlag:
    this_local = (ConfigFlagsTable *)&this->BytecodeHist;
    break;
  case CurrentSourceInfoFlag:
    this_local = (ConfigFlagsTable *)&this->CurrentSourceInfo;
    break;
  case CFGLogFlag:
    this_local = (ConfigFlagsTable *)&this->CFGLog;
    break;
  case CheckAlignmentFlag:
    this_local = (ConfigFlagsTable *)&this->CheckAlignment;
    break;
  case CheckEmitBufferPermissionsFlag:
    this_local = (ConfigFlagsTable *)&this->CheckEmitBufferPermissions;
    break;
  case CheckMemoryLeakFlag:
    this_local = (ConfigFlagsTable *)&this->CheckMemoryLeak;
    break;
  case DumpOnLeakFlag:
    this_local = (ConfigFlagsTable *)&this->DumpOnLeak;
    break;
  case CheckOpHelpersFlag:
    this_local = (ConfigFlagsTable *)&this->CheckOpHelpers;
    break;
  case CloneInlinedPolymorphicCachesFlag:
    this_local = (ConfigFlagsTable *)&this->CloneInlinedPolymorphicCaches;
    break;
  case ConcurrentRuntimeFlag:
    this_local = (ConfigFlagsTable *)&this->ConcurrentRuntime;
    break;
  case ConstructorInlineThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->ConstructorInlineThreshold;
    break;
  case ConstructorCallsRequiredToFinalizeCachedTypeFlag:
    this_local = (ConfigFlagsTable *)&this->ConstructorCallsRequiredToFinalizeCachedType;
    break;
  case PropertyCacheMissPenaltyFlag:
    this_local = (ConfigFlagsTable *)&this->PropertyCacheMissPenalty;
    break;
  case PropertyCacheMissThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->PropertyCacheMissThreshold;
    break;
  case PropertyCacheMissResetFlag:
    this_local = (ConfigFlagsTable *)&this->PropertyCacheMissReset;
    break;
  case CrashOnExceptionFlag:
    this_local = (ConfigFlagsTable *)&this->CrashOnException;
    break;
  case DebugFlag:
    this_local = (ConfigFlagsTable *)&this->Debug;
    break;
  case DebugBreakFlag:
    this_local = (ConfigFlagsTable *)&this->DebugBreak;
    break;
  case StatementDebugBreakFlag:
    this_local = (ConfigFlagsTable *)&this->StatementDebugBreak;
    break;
  case DebugBreakOnPhaseBeginFlag:
    this_local = (ConfigFlagsTable *)&this->DebugBreakOnPhaseBegin;
    break;
  case DebugWindowFlag:
    this_local = (ConfigFlagsTable *)&this->DebugWindow;
    break;
  case ParserStateCacheFlag:
    this_local = (ConfigFlagsTable *)&this->ParserStateCache;
    break;
  case CompressParserStateCacheFlag:
    this_local = (ConfigFlagsTable *)&this->CompressParserStateCache;
    break;
  case DeferTopLevelTillFirstCallFlag:
    this_local = (ConfigFlagsTable *)&this->DeferTopLevelTillFirstCall;
    break;
  case DeferParseFlag:
    this_local = (ConfigFlagsTable *)&this->DeferParse;
    break;
  case DirectCallTelemetryStatsFlag:
    this_local = (ConfigFlagsTable *)&this->DirectCallTelemetryStats;
    break;
  case DisableArrayBTreeFlag:
    this_local = (ConfigFlagsTable *)&this->DisableArrayBTree;
    break;
  case DisableRentalThreadingFlag:
    this_local = (ConfigFlagsTable *)&this->DisableRentalThreading;
    break;
  case DisableVTuneSourceLineInfoFlag:
    this_local = (ConfigFlagsTable *)&this->DisableVTuneSourceLineInfo;
    break;
  case DisplayMemStatsFlag:
    this_local = (ConfigFlagsTable *)&this->DisplayMemStats;
    break;
  case DumpFlag:
    this_local = (ConfigFlagsTable *)&this->Dump;
    break;
  case DumpIRAddressesFlag:
    this_local = (ConfigFlagsTable *)&this->DumpIRAddresses;
    break;
  case DumpLineNoInColorFlag:
    this_local = (ConfigFlagsTable *)&this->DumpLineNoInColor;
    break;
  case DumpObjectGraphOnExitFlag:
    this_local = (ConfigFlagsTable *)&this->DumpObjectGraphOnExit;
    break;
  case DumpObjectGraphOnCollectFlag:
    this_local = (ConfigFlagsTable *)&this->DumpObjectGraphOnCollect;
    break;
  case DumpEvalStringOnRemovalFlag:
    this_local = (ConfigFlagsTable *)&this->DumpEvalStringOnRemoval;
    break;
  case DumpObjectGraphOnEnumFlag:
    this_local = (ConfigFlagsTable *)&this->DumpObjectGraphOnEnum;
    break;
  case DynamicProfileCacheFlag:
    this_local = (ConfigFlagsTable *)&this->DynamicProfileCache;
    break;
  case DpcFlag:
    this_local = (ConfigFlagsTable *)&this->Dpc;
    break;
  case DynamicProfileCacheDirFlag:
    this_local = (ConfigFlagsTable *)&this->DynamicProfileCacheDir;
    break;
  case DynamicProfileInputFlag:
    this_local = (ConfigFlagsTable *)&this->DynamicProfileInput;
    break;
  case DpiFlag:
    this_local = (ConfigFlagsTable *)&this->Dpi;
    break;
  case WininetProfileCacheFlag:
    this_local = (ConfigFlagsTable *)&this->WininetProfileCache;
    break;
  case NoDynamicProfileInMemoryCacheFlag:
    this_local = (ConfigFlagsTable *)&this->NoDynamicProfileInMemoryCache;
    break;
  case ProfileBasedSpeculativeJitFlag:
    this_local = (ConfigFlagsTable *)&this->ProfileBasedSpeculativeJit;
    break;
  case ProfileBasedSpeculationCapFlag:
    this_local = (ConfigFlagsTable *)&this->ProfileBasedSpeculationCap;
    break;
  case DynamicProfileMutatorDllFlag:
    this_local = (ConfigFlagsTable *)&this->DynamicProfileMutatorDll;
    break;
  case DynamicProfileMutatorFlag:
    this_local = (ConfigFlagsTable *)&this->DynamicProfileMutator;
    break;
  case ExecuteByteCodeBufferReturnsInvalidByteCodeFlag:
    this_local = (ConfigFlagsTable *)&this->ExecuteByteCodeBufferReturnsInvalidByteCode;
    break;
  case ExpirableCollectionGCCountFlag:
    this_local = (ConfigFlagsTable *)&this->ExpirableCollectionGCCount;
    break;
  case ExpirableCollectionTriggerThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->ExpirableCollectionTriggerThreshold;
    break;
  case SkipSplitOnNoResultFlag:
    this_local = (ConfigFlagsTable *)&this->SkipSplitOnNoResult;
    break;
  case Force32BitByteCodeFlag:
    this_local = (ConfigFlagsTable *)&this->Force32BitByteCode;
    break;
  case CollectGarbageFlag:
    this_local = (ConfigFlagsTable *)&this->CollectGarbage;
    break;
  case IntlFlag:
    this_local = (ConfigFlagsTable *)&this->Intl;
    break;
  case IntlBuiltInsFlag:
    this_local = (ConfigFlagsTable *)&this->IntlBuiltIns;
    break;
  case IntlPlatformFlag:
    this_local = (ConfigFlagsTable *)&this->IntlPlatform;
    break;
  case JsBuiltInFlag:
    this_local = (ConfigFlagsTable *)&this->JsBuiltIn;
    break;
  case JitReproFlag:
    this_local = (ConfigFlagsTable *)&this->JitRepro;
    break;
  case EntryPointInfoRpcDataFlag:
    this_local = (ConfigFlagsTable *)&this->EntryPointInfoRpcData;
    break;
  case LdChakraLibFlag:
    this_local = (ConfigFlagsTable *)&this->LdChakraLib;
    break;
  case TestChakraLibFlag:
    this_local = (ConfigFlagsTable *)&this->TestChakraLib;
    break;
  case ES6Flag:
    this_local = (ConfigFlagsTable *)&this->ES6;
    break;
  case ES6AllFlag:
    this_local = (ConfigFlagsTable *)&this->ES6All;
    break;
  case ES6ExperimentalFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Experimental;
    break;
  case ES7AsyncAwaitFlag:
    this_local = (ConfigFlagsTable *)&this->ES7AsyncAwait;
    break;
  case ES6DateParseFixFlag:
    this_local = (ConfigFlagsTable *)&this->ES6DateParseFix;
    break;
  case ES6FunctionNameFullFlag:
    this_local = (ConfigFlagsTable *)&this->ES6FunctionNameFull;
    break;
  case ES6GeneratorsFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Generators;
    break;
  case ES7ExponentiationOperatorFlag:
    this_local = (ConfigFlagsTable *)&this->ES7ExponentiationOperator;
    break;
  case ES7ValuesEntriesFlag:
    this_local = (ConfigFlagsTable *)&this->ES7ValuesEntries;
    break;
  case ES7TrailingCommaFlag:
    this_local = (ConfigFlagsTable *)&this->ES7TrailingComma;
    break;
  case ES6IsConcatSpreadableFlag:
    this_local = (ConfigFlagsTable *)&this->ES6IsConcatSpreadable;
    break;
  case ES6MathFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Math;
    break;
  case ESDynamicImportFlag:
    this_local = (ConfigFlagsTable *)&this->ESDynamicImport;
    break;
  case ES6ModuleFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Module;
    break;
  case ES6ObjectFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Object;
    break;
  case ES6NumberFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Number;
    break;
  case ES6ObjectLiteralsFlag:
    this_local = (ConfigFlagsTable *)&this->ES6ObjectLiterals;
    break;
  case ES6ProxyFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Proxy;
    break;
  case ES6RestFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Rest;
    break;
  case ES6SpreadFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Spread;
    break;
  case ES6StringFlag:
    this_local = (ConfigFlagsTable *)&this->ES6String;
    break;
  case ES6StringPrototypeFixesFlag:
    this_local = (ConfigFlagsTable *)&this->ES6StringPrototypeFixes;
    break;
  case ES2018ObjectRestSpreadFlag:
    this_local = (ConfigFlagsTable *)&this->ES2018ObjectRestSpread;
    break;
  case ES6PrototypeChainFlag:
    this_local = (ConfigFlagsTable *)&this->ES6PrototypeChain;
    break;
  case ES6ToPrimitiveFlag:
    this_local = (ConfigFlagsTable *)&this->ES6ToPrimitive;
    break;
  case ES6ToLengthFlag:
    this_local = (ConfigFlagsTable *)&this->ES6ToLength;
    break;
  case ES6ToStringTagFlag:
    this_local = (ConfigFlagsTable *)&this->ES6ToStringTag;
    break;
  case ES6UnicodeFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Unicode;
    break;
  case ES6UnicodeVerboseFlag:
    this_local = (ConfigFlagsTable *)&this->ES6UnicodeVerbose;
    break;
  case ES6UnscopablesFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Unscopables;
    break;
  case ES6RegExStickyFlag:
    this_local = (ConfigFlagsTable *)&this->ES6RegExSticky;
    break;
  case ES2018RegExDotAllFlag:
    this_local = (ConfigFlagsTable *)&this->ES2018RegExDotAll;
    break;
  case ESExportNsAsFlag:
    this_local = (ConfigFlagsTable *)&this->ESExportNsAs;
    break;
  case ES2018AsyncIterationFlag:
    this_local = (ConfigFlagsTable *)&this->ES2018AsyncIteration;
    break;
  case ESTopLevelAwaitFlag:
    this_local = (ConfigFlagsTable *)&this->ESTopLevelAwait;
    break;
  case ES6RegExPrototypePropertiesFlag:
    this_local = (ConfigFlagsTable *)&this->ES6RegExPrototypeProperties;
    break;
  case ES6RegExSymbolsFlag:
    this_local = (ConfigFlagsTable *)&this->ES6RegExSymbols;
    break;
  case ES6VerboseFlag:
    this_local = (ConfigFlagsTable *)&this->ES6Verbose;
    break;
  case ESObjectGetOwnPropertyDescriptorsFlag:
    this_local = (ConfigFlagsTable *)&this->ESObjectGetOwnPropertyDescriptors;
    break;
  case ESSharedArrayBufferFlag:
    this_local = (ConfigFlagsTable *)&this->ESSharedArrayBuffer;
    break;
  case ESBigIntFlag:
    this_local = (ConfigFlagsTable *)&this->ESBigInt;
    break;
  case ESNumericSeparatorFlag:
    this_local = (ConfigFlagsTable *)&this->ESNumericSeparator;
    break;
  case ESNullishCoalescingOperatorFlag:
    this_local = (ConfigFlagsTable *)&this->ESNullishCoalescingOperator;
    break;
  case ESHashbangFlag:
    this_local = (ConfigFlagsTable *)&this->ESHashbang;
    break;
  case ESSymbolDescriptionFlag:
    this_local = (ConfigFlagsTable *)&this->ESSymbolDescription;
    break;
  case ESArrayFindFromLastFlag:
    this_local = (ConfigFlagsTable *)&this->ESArrayFindFromLast;
    break;
  case ESPromiseAnyFlag:
    this_local = (ConfigFlagsTable *)&this->ESPromiseAny;
    break;
  case ESImportMetaFlag:
    this_local = (ConfigFlagsTable *)&this->ESImportMeta;
    break;
  case ESGlobalThisFlag:
    this_local = (ConfigFlagsTable *)&this->ESGlobalThis;
    break;
  case JitES6GeneratorsFlag:
    this_local = (ConfigFlagsTable *)&this->JitES6Generators;
    break;
  case FastLineColumnCalculationFlag:
    this_local = (ConfigFlagsTable *)&this->FastLineColumnCalculation;
    break;
  case FilenameFlag:
    this_local = (ConfigFlagsTable *)&this->Filename;
    break;
  case FreeRejittedCodeFlag:
    this_local = (ConfigFlagsTable *)&this->FreeRejittedCode;
    break;
  case ForceGuardPagesFlag:
    this_local = (ConfigFlagsTable *)&this->ForceGuardPages;
    break;
  case PrintGuardPageBoundsFlag:
    this_local = (ConfigFlagsTable *)&this->PrintGuardPageBounds;
    break;
  case ForceLegacyEngineFlag:
    this_local = (ConfigFlagsTable *)&this->ForceLegacyEngine;
    break;
  case ForceFlag:
    this_local = (ConfigFlagsTable *)&this->Force;
    break;
  case StressFlag:
    this_local = (ConfigFlagsTable *)&this->Stress;
    break;
  case ForceArrayBTreeFlag:
    this_local = (ConfigFlagsTable *)&this->ForceArrayBTree;
    break;
  case StrongArraySortFlag:
    this_local = (ConfigFlagsTable *)&this->StrongArraySort;
    break;
  case ForceCleanPropertyOnCollectFlag:
    this_local = (ConfigFlagsTable *)&this->ForceCleanPropertyOnCollect;
    break;
  case ForceCleanCacheOnCollectFlag:
    this_local = (ConfigFlagsTable *)&this->ForceCleanCacheOnCollect;
    break;
  case ForceGCAfterJSONParseFlag:
    this_local = (ConfigFlagsTable *)&this->ForceGCAfterJSONParse;
    break;
  case ForceDecommitOnCollectFlag:
    this_local = (ConfigFlagsTable *)&this->ForceDecommitOnCollect;
    break;
  case ForceDeferParseFlag:
    this_local = (ConfigFlagsTable *)&this->ForceDeferParse;
    break;
  case ForceDiagnosticsModeFlag:
    this_local = (ConfigFlagsTable *)&this->ForceDiagnosticsMode;
    break;
  case ForceGetWriteWatchOOMFlag:
    this_local = (ConfigFlagsTable *)&this->ForceGetWriteWatchOOM;
    break;
  case ForcePostLowerGlobOptInstrStringFlag:
    this_local = (ConfigFlagsTable *)&this->ForcePostLowerGlobOptInstrString;
    break;
  case ForceSplitScopeFlag:
    this_local = (ConfigFlagsTable *)&this->ForceSplitScope;
    break;
  case EnumerateSpecialPropertiesInDebuggerFlag:
    this_local = (ConfigFlagsTable *)&this->EnumerateSpecialPropertiesInDebugger;
    break;
  case EnableContinueAfterExceptionWrappersForHelpersFlag:
    this_local = (ConfigFlagsTable *)&this->EnableContinueAfterExceptionWrappersForHelpers;
    break;
  case EnableContinueAfterExceptionWrappersForBuiltInsFlag:
    this_local = (ConfigFlagsTable *)&this->EnableContinueAfterExceptionWrappersForBuiltIns;
    break;
  case EnableFunctionSourceReportForHeapEnumFlag:
    this_local = (ConfigFlagsTable *)&this->EnableFunctionSourceReportForHeapEnum;
    break;
  case ForceFragmentAddressSpaceFlag:
    this_local = (ConfigFlagsTable *)&this->ForceFragmentAddressSpace;
    break;
  case ForceOOMOnEBCommitFlag:
    this_local = (ConfigFlagsTable *)&this->ForceOOMOnEBCommit;
    break;
  case ForceDynamicProfileFlag:
    this_local = (ConfigFlagsTable *)&this->ForceDynamicProfile;
    break;
  case ForceES5ArrayFlag:
    this_local = (ConfigFlagsTable *)&this->ForceES5Array;
    break;
  case ForceAsmJsLinkFailFlag:
    this_local = (ConfigFlagsTable *)&this->ForceAsmJsLinkFail;
    break;
  case ForceExpireOnNonCacheCollectFlag:
    this_local = (ConfigFlagsTable *)&this->ForceExpireOnNonCacheCollect;
    break;
  case ForceFastPathFlag:
    this_local = (ConfigFlagsTable *)&this->ForceFastPath;
    break;
  case ForceFloatPrefFlag:
    this_local = (ConfigFlagsTable *)&this->ForceFloatPref;
    break;
  case ForceJITLoopBodyFlag:
    this_local = (ConfigFlagsTable *)&this->ForceJITLoopBody;
    break;
  case ForceStaticInterpreterThunkFlag:
    this_local = (ConfigFlagsTable *)&this->ForceStaticInterpreterThunk;
    break;
  case DumpCommentsFromReferencedFilesFlag:
    this_local = (ConfigFlagsTable *)&this->DumpCommentsFromReferencedFiles;
    break;
  case DelayFullJITSmallFuncFlag:
    this_local = (ConfigFlagsTable *)&this->DelayFullJITSmallFunc;
    break;
  case EnableFatalErrorOnOOMFlag:
    this_local = (ConfigFlagsTable *)&this->EnableFatalErrorOnOOM;
    break;
  case DeferLoadingAvailableSourceFlag:
    this_local = (ConfigFlagsTable *)&this->DeferLoadingAvailableSource;
    break;
  case ForceNativeFlag:
    this_local = (ConfigFlagsTable *)&this->ForceNative;
    break;
  case ForceSerializedFlag:
    this_local = (ConfigFlagsTable *)&this->ForceSerialized;
    break;
  case ForceSerializedBytecodeMajorVersionFlag:
    this_local = (ConfigFlagsTable *)&this->ForceSerializedBytecodeMajorVersion;
    break;
  case ForceSerializedBytecodeVersionSchemaFlag:
    this_local = (ConfigFlagsTable *)&this->ForceSerializedBytecodeVersionSchema;
    break;
  case ForceStrictModeFlag:
    this_local = (ConfigFlagsTable *)&this->ForceStrictMode;
    break;
  case ForceUndoDeferFlag:
    this_local = (ConfigFlagsTable *)&this->ForceUndoDefer;
    break;
  case ForceBlockingConcurrentCollectFlag:
    this_local = (ConfigFlagsTable *)&this->ForceBlockingConcurrentCollect;
    break;
  case FreTestDiagModeFlag:
    this_local = (ConfigFlagsTable *)&this->FreTestDiagMode;
    break;
  case ByteCodeBranchLimitFlag:
    this_local = (ConfigFlagsTable *)&this->ByteCodeBranchLimit;
    break;
  case MediumByteCodeLayoutFlag:
    this_local = (ConfigFlagsTable *)&this->MediumByteCodeLayout;
    break;
  case LargeByteCodeLayoutFlag:
    this_local = (ConfigFlagsTable *)&this->LargeByteCodeLayout;
    break;
  case InduceCodeGenFailureFlag:
    this_local = (ConfigFlagsTable *)&this->InduceCodeGenFailure;
    break;
  case InduceCodeGenFailureSeedFlag:
    this_local = (ConfigFlagsTable *)&this->InduceCodeGenFailureSeed;
    break;
  case InjectPartiallyInitializedInterpreterFrameErrorFlag:
    this_local = (ConfigFlagsTable *)&this->InjectPartiallyInitializedInterpreterFrameError;
    break;
  case InjectPartiallyInitializedInterpreterFrameErrorTypeFlag:
    this_local = (ConfigFlagsTable *)&this->InjectPartiallyInitializedInterpreterFrameErrorType;
    break;
  case GenerateByteCodeBufferReturnsCantGenerateFlag:
    this_local = (ConfigFlagsTable *)&this->GenerateByteCodeBufferReturnsCantGenerate;
    break;
  case GoptCleanupThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->GoptCleanupThreshold;
    break;
  case AsmGoptCleanupThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->AsmGoptCleanupThreshold;
    break;
  case HighPrecisionDateFlag:
    this_local = (ConfigFlagsTable *)&this->HighPrecisionDate;
    break;
  case InlineCountMaxFlag:
    this_local = (ConfigFlagsTable *)&this->InlineCountMax;
    break;
  case InlineCountMaxInLoopBodiesFlag:
    this_local = (ConfigFlagsTable *)&this->InlineCountMaxInLoopBodies;
    break;
  case icminlbFlag:
    this_local = (ConfigFlagsTable *)&this->icminlb;
    break;
  case InlineInLoopBodyScaleDownFactorFlag:
    this_local = (ConfigFlagsTable *)&this->InlineInLoopBodyScaleDownFactor;
    break;
  case iilbsdfFlag:
    this_local = (ConfigFlagsTable *)&this->iilbsdf;
    break;
  case InlineThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->InlineThreshold;
    break;
  case AggressiveInlineCountMaxFlag:
    this_local = (ConfigFlagsTable *)&this->AggressiveInlineCountMax;
    break;
  case AggressiveInlineThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->AggressiveInlineThreshold;
    break;
  case InlineThresholdAdjustCountInLargeFunctionFlag:
    this_local = (ConfigFlagsTable *)&this->InlineThresholdAdjustCountInLargeFunction;
    break;
  case InlineThresholdAdjustCountInMediumSizedFunctionFlag:
    this_local = (ConfigFlagsTable *)&this->InlineThresholdAdjustCountInMediumSizedFunction;
    break;
  case InlineThresholdAdjustCountInSmallFunctionFlag:
    this_local = (ConfigFlagsTable *)&this->InlineThresholdAdjustCountInSmallFunction;
    break;
  case AsmJsInlineAdjustFlag:
    this_local = (ConfigFlagsTable *)&this->AsmJsInlineAdjust;
    break;
  case InterpretFlag:
    this_local = (ConfigFlagsTable *)&this->Interpret;
    break;
  case InstrumentFlag:
    this_local = (ConfigFlagsTable *)&this->Instrument;
    break;
  case JitQueueThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->JitQueueThreshold;
    break;
  case LeakReportFlag:
    this_local = (ConfigFlagsTable *)&this->LeakReport;
    break;
  case LoopInlineThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->LoopInlineThreshold;
    break;
  case LeafInlineThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->LeafInlineThreshold;
    break;
  case ConstantArgumentInlineThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->ConstantArgumentInlineThreshold;
    break;
  case RecursiveInlineThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->RecursiveInlineThreshold;
    break;
  case RecursiveInlineDepthMaxFlag:
    this_local = (ConfigFlagsTable *)&this->RecursiveInlineDepthMax;
    break;
  case RecursiveInlineDepthMinFlag:
    this_local = (ConfigFlagsTable *)&this->RecursiveInlineDepthMin;
    break;
  case RedeferralCapFlag:
    this_local = (ConfigFlagsTable *)&this->RedeferralCap;
    break;
  case LoopFlag:
    this_local = (ConfigFlagsTable *)&this->Loop;
    break;
  case LoopInterpretCountFlag:
    this_local = (ConfigFlagsTable *)&this->LoopInterpretCount;
    break;
  case licFlag:
    this_local = (ConfigFlagsTable *)&this->lic;
    break;
  case LoopProfileIterationsFlag:
    this_local = (ConfigFlagsTable *)&this->LoopProfileIterations;
    break;
  case OutsideLoopInlineThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->OutsideLoopInlineThreshold;
    break;
  case MaxFuncInlineDepthFlag:
    this_local = (ConfigFlagsTable *)&this->MaxFuncInlineDepth;
    break;
  case MaxNumberOfInlineesWithLoopFlag:
    this_local = (ConfigFlagsTable *)&this->MaxNumberOfInlineesWithLoop;
    break;
  case MemspectFlag:
    this_local = (ConfigFlagsTable *)&this->Memspect;
    break;
  case PolymorphicInlineThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->PolymorphicInlineThreshold;
    break;
  case PrimeRecyclerFlag:
    this_local = (ConfigFlagsTable *)&this->PrimeRecycler;
    break;
  case PrivateHeapFlag:
    this_local = (ConfigFlagsTable *)&this->PrivateHeap;
    break;
  case TraceEngineRefcountFlag:
    this_local = (ConfigFlagsTable *)&this->TraceEngineRefcount;
    break;
  case LeakStackTraceFlag:
    this_local = (ConfigFlagsTable *)&this->LeakStackTrace;
    break;
  case ForceMemoryLeakFlag:
    this_local = (ConfigFlagsTable *)&this->ForceMemoryLeak;
    break;
  case DumpAfterFinalGCFlag:
    this_local = (ConfigFlagsTable *)&this->DumpAfterFinalGC;
    break;
  case ForceOldDateAPIFlag:
    this_local = (ConfigFlagsTable *)&this->ForceOldDateAPI;
    break;
  case JitLoopBodyHotLoopThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->JitLoopBodyHotLoopThreshold;
    break;
  case LoopBodySizeThresholdToDisableOptsFlag:
    this_local = (ConfigFlagsTable *)&this->LoopBodySizeThresholdToDisableOpts;
    break;
  case MaxJitThreadCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxJitThreadCount;
    break;
  case ForceMaxJitThreadCountFlag:
    this_local = (ConfigFlagsTable *)&this->ForceMaxJitThreadCount;
    break;
  case MitigateSpectreFlag:
    this_local = (ConfigFlagsTable *)&this->MitigateSpectre;
    break;
  case AddMaskingBlocksFlag:
    this_local = (ConfigFlagsTable *)&this->AddMaskingBlocks;
    break;
  case PoisonVarArrayLoadFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonVarArrayLoad;
    break;
  case PoisonIntArrayLoadFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonIntArrayLoad;
    break;
  case PoisonFloatArrayLoadFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonFloatArrayLoad;
    break;
  case PoisonTypedArrayLoadFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonTypedArrayLoad;
    break;
  case PoisonStringLoadFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonStringLoad;
    break;
  case PoisonObjectsForLoadsFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonObjectsForLoads;
    break;
  case PoisonVarArrayStoreFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonVarArrayStore;
    break;
  case PoisonIntArrayStoreFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonIntArrayStore;
    break;
  case PoisonFloatArrayStoreFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonFloatArrayStore;
    break;
  case PoisonTypedArrayStoreFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonTypedArrayStore;
    break;
  case PoisonStringStoreFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonStringStore;
    break;
  case PoisonObjectsForStoresFlag:
    this_local = (ConfigFlagsTable *)&this->PoisonObjectsForStores;
    break;
  case MinInterpretCountFlag:
    this_local = (ConfigFlagsTable *)&this->MinInterpretCount;
    break;
  case MinSimpleJitRunCountFlag:
    this_local = (ConfigFlagsTable *)&this->MinSimpleJitRunCount;
    break;
  case MaxInterpretCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxInterpretCount;
    break;
  case MicFlag:
    this_local = (ConfigFlagsTable *)&this->Mic;
    break;
  case MaxSimpleJitRunCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxSimpleJitRunCount;
    break;
  case MsjrcFlag:
    this_local = (ConfigFlagsTable *)&this->Msjrc;
    break;
  case MinMemOpCountFlag:
    this_local = (ConfigFlagsTable *)&this->MinMemOpCount;
    break;
  case MmocFlag:
    this_local = (ConfigFlagsTable *)&this->Mmoc;
    break;
  case MaxCopyOnAccessArrayLengthFlag:
    this_local = (ConfigFlagsTable *)&this->MaxCopyOnAccessArrayLength;
    break;
  case MinCopyOnAccessArrayLengthFlag:
    this_local = (ConfigFlagsTable *)&this->MinCopyOnAccessArrayLength;
    break;
  case CopyOnAccessArraySegmentCacheSizeFlag:
    this_local = (ConfigFlagsTable *)&this->CopyOnAccessArraySegmentCacheSize;
    break;
  case MinTemplatizedJitRunCountFlag:
    this_local = (ConfigFlagsTable *)&this->MinTemplatizedJitRunCount;
    break;
  case MinAsmJsInterpreterRunCountFlag:
    this_local = (ConfigFlagsTable *)&this->MinAsmJsInterpreterRunCount;
    break;
  case MinTemplatizedJitLoopRunCountFlag:
    this_local = (ConfigFlagsTable *)&this->MinTemplatizedJitLoopRunCount;
    break;
  case MaxTemplatizedJitRunCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxTemplatizedJitRunCount;
    break;
  case MtjrcFlag:
    this_local = (ConfigFlagsTable *)&this->Mtjrc;
    break;
  case MaxAsmJsInterpreterRunCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxAsmJsInterpreterRunCount;
    break;
  case MaicFlag:
    this_local = (ConfigFlagsTable *)&this->Maic;
    break;
  case AutoProfilingInterpreter0LimitFlag:
    this_local = (ConfigFlagsTable *)&this->AutoProfilingInterpreter0Limit;
    break;
  case ProfilingInterpreter0LimitFlag:
    this_local = (ConfigFlagsTable *)&this->ProfilingInterpreter0Limit;
    break;
  case AutoProfilingInterpreter1LimitFlag:
    this_local = (ConfigFlagsTable *)&this->AutoProfilingInterpreter1Limit;
    break;
  case SimpleJitLimitFlag:
    this_local = (ConfigFlagsTable *)&this->SimpleJitLimit;
    break;
  case ProfilingInterpreter1LimitFlag:
    this_local = (ConfigFlagsTable *)&this->ProfilingInterpreter1Limit;
    break;
  case ExecutionModeLimitsFlag:
    this_local = (ConfigFlagsTable *)&this->ExecutionModeLimits;
    break;
  case EmlFlag:
    this_local = (ConfigFlagsTable *)&this->Eml;
    break;
  case EnforceExecutionModeLimitsFlag:
    this_local = (ConfigFlagsTable *)&this->EnforceExecutionModeLimits;
    break;
  case EemlFlag:
    this_local = (ConfigFlagsTable *)&this->Eeml;
    break;
  case SimpleJitAfterFlag:
    this_local = (ConfigFlagsTable *)&this->SimpleJitAfter;
    break;
  case SjaFlag:
    this_local = (ConfigFlagsTable *)&this->Sja;
    break;
  case FullJitAfterFlag:
    this_local = (ConfigFlagsTable *)&this->FullJitAfter;
    break;
  case FjaFlag:
    this_local = (ConfigFlagsTable *)&this->Fja;
    break;
  case NewSimpleJitFlag:
    this_local = (ConfigFlagsTable *)&this->NewSimpleJit;
    break;
  case MaxLinearIntCaseCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxLinearIntCaseCount;
    break;
  case MaxSingleCharStrJumpTableSizeFlag:
    this_local = (ConfigFlagsTable *)&this->MaxSingleCharStrJumpTableSize;
    break;
  case MaxSingleCharStrJumpTableRatioFlag:
    this_local = (ConfigFlagsTable *)&this->MaxSingleCharStrJumpTableRatio;
    break;
  case MinSwitchJumpTableSizeFlag:
    this_local = (ConfigFlagsTable *)&this->MinSwitchJumpTableSize;
    break;
  case MaxLinearStringCaseCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxLinearStringCaseCount;
    break;
  case MinDeferredFuncTokenCountFlag:
    this_local = (ConfigFlagsTable *)&this->MinDeferredFuncTokenCount;
    break;
  case SkipFuncCountForBailOnNoProfileFlag:
    this_local = (ConfigFlagsTable *)&this->SkipFuncCountForBailOnNoProfile;
    break;
  case MaxJITFunctionBytecodeByteLengthFlag:
    this_local = (ConfigFlagsTable *)&this->MaxJITFunctionBytecodeByteLength;
    break;
  case MaxJITFunctionBytecodeCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxJITFunctionBytecodeCount;
    break;
  case MaxLoopsPerFunctionFlag:
    this_local = (ConfigFlagsTable *)&this->MaxLoopsPerFunction;
    break;
  case FuncObjectInlineCacheThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->FuncObjectInlineCacheThreshold;
    break;
  case NoDeferParseFlag:
    this_local = (ConfigFlagsTable *)&this->NoDeferParse;
    break;
  case NoLogoFlag:
    this_local = (ConfigFlagsTable *)&this->NoLogo;
    break;
  case OOPJITMissingOptsFlag:
    this_local = (ConfigFlagsTable *)&this->OOPJITMissingOpts;
    break;
  case CrashOnOOPJITFailureFlag:
    this_local = (ConfigFlagsTable *)&this->CrashOnOOPJITFailure;
    break;
  case OOPCFGRegistrationFlag:
    this_local = (ConfigFlagsTable *)&this->OOPCFGRegistration;
    break;
  case ForceJITCFGCheckFlag:
    this_local = (ConfigFlagsTable *)&this->ForceJITCFGCheck;
    break;
  case UseJITTrampolineFlag:
    this_local = (ConfigFlagsTable *)&this->UseJITTrampoline;
    break;
  case NoNativeFlag:
    this_local = (ConfigFlagsTable *)&this->NoNative;
    break;
  case NopFrequencyFlag:
    this_local = (ConfigFlagsTable *)&this->NopFrequency;
    break;
  case NoStrictModeFlag:
    this_local = (ConfigFlagsTable *)&this->NoStrictMode;
    break;
  case NormalizeStatsFlag:
    this_local = (ConfigFlagsTable *)&this->NormalizeStats;
    break;
  case OffFlag:
    this_local = (ConfigFlagsTable *)&this->Off;
    break;
  case OffProfiledByteCodeFlag:
    this_local = (ConfigFlagsTable *)&this->OffProfiledByteCode;
    break;
  case OnFlag:
    this_local = (ConfigFlagsTable *)&this->On;
    break;
  case OutputFileFlag:
    this_local = (ConfigFlagsTable *)&this->OutputFile;
    break;
  case OutputFileOpenModeFlag:
    this_local = (ConfigFlagsTable *)&this->OutputFileOpenMode;
    break;
  case InMemoryTraceFlag:
    this_local = (ConfigFlagsTable *)&this->InMemoryTrace;
    break;
  case InMemoryTraceBufferSizeFlag:
    this_local = (ConfigFlagsTable *)&this->InMemoryTraceBufferSize;
    break;
  case TraceWithStackFlag:
    this_local = (ConfigFlagsTable *)&this->TraceWithStack;
    break;
  case PrintRunTimeDataCollectionTraceFlag:
    this_local = (ConfigFlagsTable *)&this->PrintRunTimeDataCollectionTrace;
    break;
  case PrejitFlag:
    this_local = (ConfigFlagsTable *)&this->Prejit;
    break;
  case PrintSrcInDumpFlag:
    this_local = (ConfigFlagsTable *)&this->PrintSrcInDump;
    break;
  case ProfileDictionaryFlag:
    this_local = (ConfigFlagsTable *)&this->ProfileDictionary;
    break;
  case ProfileFlag:
    this_local = (ConfigFlagsTable *)&this->Profile;
    break;
  case ProfileThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->ProfileThreshold;
    break;
  case ProfileObjectLiteralFlag:
    this_local = (ConfigFlagsTable *)&this->ProfileObjectLiteral;
    break;
  case ProfileMemoryFlag:
    this_local = (ConfigFlagsTable *)&this->ProfileMemory;
    break;
  case ProfileStringsFlag:
    this_local = (ConfigFlagsTable *)&this->ProfileStrings;
    break;
  case ProfileTypesFlag:
    this_local = (ConfigFlagsTable *)&this->ProfileTypes;
    break;
  case ProfileEvalMapFlag:
    this_local = (ConfigFlagsTable *)&this->ProfileEvalMap;
    break;
  case ProfileBailOutRecordMemoryFlag:
    this_local = (ConfigFlagsTable *)&this->ProfileBailOutRecordMemory;
    break;
  case ValidateIntRangesFlag:
    this_local = (ConfigFlagsTable *)&this->ValidateIntRanges;
    break;
  case RejitMaxBailOutCountFlag:
    this_local = (ConfigFlagsTable *)&this->RejitMaxBailOutCount;
    break;
  case CallsToBailoutsRatioForRejitFlag:
    this_local = (ConfigFlagsTable *)&this->CallsToBailoutsRatioForRejit;
    break;
  case LoopIterationsToBailoutsRatioForRejitFlag:
    this_local = (ConfigFlagsTable *)&this->LoopIterationsToBailoutsRatioForRejit;
    break;
  case MinBailOutsBeforeRejitFlag:
    this_local = (ConfigFlagsTable *)&this->MinBailOutsBeforeRejit;
    break;
  case MinBailOutsBeforeRejitForLoopsFlag:
    this_local = (ConfigFlagsTable *)&this->MinBailOutsBeforeRejitForLoops;
    break;
  case LibraryStackFrameFlag:
    this_local = (ConfigFlagsTable *)&this->LibraryStackFrame;
    break;
  case LibraryStackFrameDebuggerFlag:
    this_local = (ConfigFlagsTable *)&this->LibraryStackFrameDebugger;
    break;
  case RecyclerStressFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerStress;
    break;
  case RecyclerBackgroundStressFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerBackgroundStress;
    break;
  case RecyclerConcurrentStressFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerConcurrentStress;
    break;
  case RecyclerConcurrentRepeatStressFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerConcurrentRepeatStress;
    break;
  case RecyclerPartialStressFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerPartialStress;
    break;
  case RecyclerTrackStressFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerTrackStress;
    break;
  case RecyclerInduceFalsePositivesFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerInduceFalsePositives;
    break;
  case RecyclerForceMarkInteriorFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerForceMarkInterior;
    break;
  case RecyclerPriorityBoostTimeoutFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerPriorityBoostTimeout;
    break;
  case RecyclerThreadCollectTimeoutFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerThreadCollectTimeout;
    break;
  case EnableConcurrentSweepAllocFlag:
    this_local = (ConfigFlagsTable *)&this->EnableConcurrentSweepAlloc;
    break;
  case ecsaFlag:
    this_local = (ConfigFlagsTable *)&this->ecsa;
    break;
  case PageHeapFlag:
    this_local = (ConfigFlagsTable *)&this->PageHeap;
    break;
  case PageHeapAllocStackFlag:
    this_local = (ConfigFlagsTable *)&this->PageHeapAllocStack;
    break;
  case PageHeapFreeStackFlag:
    this_local = (ConfigFlagsTable *)&this->PageHeapFreeStack;
    break;
  case PageHeapBucketNumberFlag:
    this_local = (ConfigFlagsTable *)&this->PageHeapBucketNumber;
    break;
  case PageHeapBlockTypeFlag:
    this_local = (ConfigFlagsTable *)&this->PageHeapBlockType;
    break;
  case PageHeapDecommitGuardPageFlag:
    this_local = (ConfigFlagsTable *)&this->PageHeapDecommitGuardPage;
    break;
  case RecyclerNoPageReuseFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerNoPageReuse;
    break;
  case RecyclerVerifyFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerVerify;
    break;
  case RecyclerVerifyPadSizeFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerVerifyPadSize;
    break;
  case RecyclerTestFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerTest;
    break;
  case RecyclerProtectPagesOnRescanFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerProtectPagesOnRescan;
    break;
  case RecyclerVerifyMarkFlag:
    this_local = (ConfigFlagsTable *)&this->RecyclerVerifyMark;
    break;
  case LowMemoryCapFlag:
    this_local = (ConfigFlagsTable *)&this->LowMemoryCap;
    break;
  case NewPagesCapDuringBGSweepingFlag:
    this_local = (ConfigFlagsTable *)&this->NewPagesCapDuringBGSweeping;
    break;
  case AllocPolicyLimitFlag:
    this_local = (ConfigFlagsTable *)&this->AllocPolicyLimit;
    break;
  case RuntimeDataOutputFileFlag:
    this_local = (ConfigFlagsTable *)&this->RuntimeDataOutputFile;
    break;
  case SpeculationCapFlag:
    this_local = (ConfigFlagsTable *)&this->SpeculationCap;
    break;
  case StatsFlag:
    this_local = (ConfigFlagsTable *)&this->Stats;
    break;
  case SwallowExceptionsFlag:
    this_local = (ConfigFlagsTable *)&this->SwallowExceptions;
    break;
  case PrintSystemExceptionFlag:
    this_local = (ConfigFlagsTable *)&this->PrintSystemException;
    break;
  case SwitchOptHolesThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->SwitchOptHolesThreshold;
    break;
  case TempMinFlag:
    this_local = (ConfigFlagsTable *)&this->TempMin;
    break;
  case TempMaxFlag:
    this_local = (ConfigFlagsTable *)&this->TempMax;
    break;
  case TraceFlag:
    this_local = (ConfigFlagsTable *)&this->Trace;
    break;
  case LoopAlignNopLimitFlag:
    this_local = (ConfigFlagsTable *)&this->LoopAlignNopLimit;
    break;
  case TraceMemoryFlag:
    this_local = (ConfigFlagsTable *)&this->TraceMemory;
    break;
  case TraceMetaDataParsingFlag:
    this_local = (ConfigFlagsTable *)&this->TraceMetaDataParsing;
    break;
  case TraceWin8AllocationsFlag:
    this_local = (ConfigFlagsTable *)&this->TraceWin8Allocations;
    break;
  case TraceWin8DeallocationsImmediateFlag:
    this_local = (ConfigFlagsTable *)&this->TraceWin8DeallocationsImmediate;
    break;
  case PrintWin8StatsDetailedFlag:
    this_local = (ConfigFlagsTable *)&this->PrintWin8StatsDetailed;
    break;
  case TraceProtectPagesFlag:
    this_local = (ConfigFlagsTable *)&this->TraceProtectPages;
    break;
  case TraceAsyncDebugCallsFlag:
    this_local = (ConfigFlagsTable *)&this->TraceAsyncDebugCalls;
    break;
  case TrackDispatchFlag:
    this_local = (ConfigFlagsTable *)&this->TrackDispatch;
    break;
  case VerboseFlag:
    this_local = (ConfigFlagsTable *)&this->Verbose;
    break;
  case UseFullNameFlag:
    this_local = (ConfigFlagsTable *)&this->UseFullName;
    break;
  case Utf8Flag:
    this_local = (ConfigFlagsTable *)&this->Utf8;
    break;
  case VersionFlag:
    this_local = (ConfigFlagsTable *)&this->Version;
    break;
  case WERExceptionSupportFlag:
    this_local = (ConfigFlagsTable *)&this->WERExceptionSupport;
    break;
  case ExtendedErrorStackForTestHostFlag:
    this_local = (ConfigFlagsTable *)&this->ExtendedErrorStackForTestHost;
    break;
  case errorStackTraceFlag:
    this_local = (ConfigFlagsTable *)&this->errorStackTrace;
    break;
  case DoHeapEnumOnEngineShutdownFlag:
    this_local = (ConfigFlagsTable *)&this->DoHeapEnumOnEngineShutdown;
    break;
  case RegexTracingFlag:
    this_local = (ConfigFlagsTable *)&this->RegexTracing;
    break;
  case RegexProfileFlag:
    this_local = (ConfigFlagsTable *)&this->RegexProfile;
    break;
  case RegexDebugFlag:
    this_local = (ConfigFlagsTable *)&this->RegexDebug;
    break;
  case RegexDebugASTFlag:
    this_local = (ConfigFlagsTable *)&this->RegexDebugAST;
    break;
  case RegexDebugAnnotatedASTFlag:
    this_local = (ConfigFlagsTable *)&this->RegexDebugAnnotatedAST;
    break;
  case RegexBytecodeDebugFlag:
    this_local = (ConfigFlagsTable *)&this->RegexBytecodeDebug;
    break;
  case RegexOptimizeFlag:
    this_local = (ConfigFlagsTable *)&this->RegexOptimize;
    break;
  case DynamicRegexMruListSizeFlag:
    this_local = (ConfigFlagsTable *)&this->DynamicRegexMruListSize;
    break;
  case OptimizeForManyInstancesFlag:
    this_local = (ConfigFlagsTable *)&this->OptimizeForManyInstances;
    break;
  case EnableArrayTypeMutationFlag:
    this_local = (ConfigFlagsTable *)&this->EnableArrayTypeMutation;
    break;
  case ArrayMutationTestSeedFlag:
    this_local = (ConfigFlagsTable *)&this->ArrayMutationTestSeed;
    break;
  case TestTraceFlag:
    this_local = (ConfigFlagsTable *)&this->TestTrace;
    break;
  case EnableEvalMapCleanupFlag:
    this_local = (ConfigFlagsTable *)&this->EnableEvalMapCleanup;
    break;
  case TraceObjectAllocationFlag:
    this_local = (ConfigFlagsTable *)&this->TraceObjectAllocation;
    break;
  case SseFlag:
    this_local = (ConfigFlagsTable *)&this->Sse;
    break;
  case DeletedPropertyReuseThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->DeletedPropertyReuseThreshold;
    break;
  case ForceStringKeyedSimpleDictionaryTypeHandlerFlag:
    this_local = (ConfigFlagsTable *)&this->ForceStringKeyedSimpleDictionaryTypeHandler;
    break;
  case BigDictionaryTypeHandlerThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->BigDictionaryTypeHandlerThreshold;
    break;
  case TypeSnapshotEnumerationFlag:
    this_local = (ConfigFlagsTable *)&this->TypeSnapshotEnumeration;
    break;
  case IsolatePrototypesFlag:
    this_local = (ConfigFlagsTable *)&this->IsolatePrototypes;
    break;
  case ChangeTypeOnProtoFlag:
    this_local = (ConfigFlagsTable *)&this->ChangeTypeOnProto;
    break;
  case ShareInlineCachesFlag:
    this_local = (ConfigFlagsTable *)&this->ShareInlineCaches;
    break;
  case DisableDebugObjectFlag:
    this_local = (ConfigFlagsTable *)&this->DisableDebugObject;
    break;
  case DumpHeapFlag:
    this_local = (ConfigFlagsTable *)&this->DumpHeap;
    break;
  case autoProxyFlag:
    this_local = (ConfigFlagsTable *)&this->autoProxy;
    break;
  case PerfHintLevelFlag:
    this_local = (ConfigFlagsTable *)&this->PerfHintLevel;
    break;
  case MemProtectHeapStressFlag:
    this_local = (ConfigFlagsTable *)&this->MemProtectHeapStress;
    break;
  case MemProtectHeapBackgroundStressFlag:
    this_local = (ConfigFlagsTable *)&this->MemProtectHeapBackgroundStress;
    break;
  case MemProtectHeapConcurrentStressFlag:
    this_local = (ConfigFlagsTable *)&this->MemProtectHeapConcurrentStress;
    break;
  case MemProtectHeapConcurrentRepeatStressFlag:
    this_local = (ConfigFlagsTable *)&this->MemProtectHeapConcurrentRepeatStress;
    break;
  case MemProtectHeapPartialStressFlag:
    this_local = (ConfigFlagsTable *)&this->MemProtectHeapPartialStress;
    break;
  case FixPropsOnPathTypesFlag:
    this_local = (ConfigFlagsTable *)&this->FixPropsOnPathTypes;
    break;
  case BailoutTraceFilterFlag:
    this_local = (ConfigFlagsTable *)&this->BailoutTraceFilter;
    break;
  case RejitTraceFilterFlag:
    this_local = (ConfigFlagsTable *)&this->RejitTraceFilter;
    break;
  case MaxBackgroundFinishMarkCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxBackgroundFinishMarkCount;
    break;
  case BackgroundFinishMarkWaitTimeFlag:
    this_local = (ConfigFlagsTable *)&this->BackgroundFinishMarkWaitTime;
    break;
  case MinBackgroundRepeatMarkRescanBytesFlag:
    this_local = (ConfigFlagsTable *)&this->MinBackgroundRepeatMarkRescanBytes;
    break;
  case ZeroMemoryWithNonTemporalStoreFlag:
    this_local = (ConfigFlagsTable *)&this->ZeroMemoryWithNonTemporalStore;
    break;
  case MaxMarkStackPageCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxMarkStackPageCount;
    break;
  case MaxTrackedObjectListCountFlag:
    this_local = (ConfigFlagsTable *)&this->MaxTrackedObjectListCount;
    break;
  case NumberAllocPlusSizeFlag:
    this_local = (ConfigFlagsTable *)&this->NumberAllocPlusSize;
    break;
  case InitializeInterpreterSlotsWithInvalidStackVarFlag:
    this_local = (ConfigFlagsTable *)&this->InitializeInterpreterSlotsWithInvalidStackVar;
    break;
  case PRNGSeed0Flag:
    this_local = (ConfigFlagsTable *)&this->PRNGSeed0;
    break;
  case PRNGSeed1Flag:
    this_local = (ConfigFlagsTable *)&this->PRNGSeed1;
    break;
  case ClearInlineCachesOnCollectFlag:
    this_local = (ConfigFlagsTable *)&this->ClearInlineCachesOnCollect;
    break;
  case InlineCacheInvalidationListCompactionThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->InlineCacheInvalidationListCompactionThreshold;
    break;
  case ConstructorCacheInvalidationThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->ConstructorCacheInvalidationThreshold;
    break;
  case GCMemoryThresholdFlag:
    this_local = (ConfigFlagsTable *)&this->GCMemoryThreshold;
    break;
  case SimulatePolyCacheWithOneTypeForInlineCacheIndexFlag:
    this_local = (ConfigFlagsTable *)&this->SimulatePolyCacheWithOneTypeForInlineCacheIndex;
    break;
  case JITServerIdleTimeoutFlag:
    this_local = (ConfigFlagsTable *)&this->JITServerIdleTimeout;
    break;
  case JITServerMaxInactivePageAllocatorCountFlag:
    this_local = (ConfigFlagsTable *)&this->JITServerMaxInactivePageAllocatorCount;
    break;
  case StrictWriteBarrierCheckFlag:
    this_local = (ConfigFlagsTable *)&this->StrictWriteBarrierCheck;
    break;
  case WriteBarrierTestFlag:
    this_local = (ConfigFlagsTable *)&this->WriteBarrierTest;
    break;
  case ForceSoftwareWriteBarrierFlag:
    this_local = (ConfigFlagsTable *)&this->ForceSoftwareWriteBarrier;
    break;
  case VerifyBarrierBitFlag:
    this_local = (ConfigFlagsTable *)&this->VerifyBarrierBit;
    break;
  case EnableBGFreeZeroFlag:
    this_local = (ConfigFlagsTable *)&this->EnableBGFreeZero;
    break;
  case KeepRecyclerTrackDataFlag:
    this_local = (ConfigFlagsTable *)&this->KeepRecyclerTrackData;
    break;
  case MaxSingleAllocSizeInMBFlag:
    this_local = (ConfigFlagsTable *)&this->MaxSingleAllocSizeInMB;
    break;
  default:
    this_local = (ConfigFlagsTable *)0x0;
  }
  return this_local;
}

Assistant:

void *
    ConfigFlagsTable::GetProperty(Flag flag) const
    {
        switch(flag)
        {
        #define FLAG(type, name, ...) \
            \
            case name##Flag : \
                return reinterpret_cast<void*>(const_cast<type*>(&##name)); \

        #include "ConfigFlagsList.h"

            default:
                return NULL;
        }
    }